

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O0

char * fy_tag_directive_token_handle(fy_token *fyt,size_t *lenp)

{
  char *ptr;
  size_t *lenp_local;
  fy_token *fyt_local;
  
  if ((fyt == (fy_token *)0x0) || (fyt->type != FYTT_TAG_DIRECTIVE)) {
    *lenp = 0;
    fyt_local = (fy_token *)0x0;
  }
  else {
    fyt_local = (fy_token *)fy_atom_data(&fyt->handle);
    *lenp = (ulong)(fyt->field_9).tag_directive.tag_length;
  }
  return (char *)fyt_local;
}

Assistant:

const char *fy_tag_directive_token_handle(struct fy_token *fyt, size_t *lenp) {
    const char *ptr;

    if (!fyt || fyt->type != FYTT_TAG_DIRECTIVE) {
        *lenp = 0;
        return NULL;
    }
    ptr = fy_atom_data(&fyt->handle);
    *lenp = fyt->tag_directive.tag_length;
    return ptr;
}